

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

int __thiscall
slang::SmallVectorBase<slang::syntax::CaseItemSyntax_*>::copy
          (SmallVectorBase<slang::syntax::CaseItemSyntax_*> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  byte *__dest;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    __dest = (byte *)0x0;
  }
  else {
    __dest = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
    if (*(byte **)(dst + 8) < __dest + sVar1 * 8) {
      __dest = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 << 3,8);
    }
    else {
      *(byte **)(*(long *)dst + 8) = __dest + sVar1 * 8;
    }
    if (this->len != 0) {
      memmove(__dest,this->data_,this->len << 3);
    }
    if (this->len != 0 && __dest == (byte *)0x0) {
      std::terminate();
    }
  }
  return (int)__dest;
}

Assistant:

[[nodiscard]] span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::uninitialized_copy(begin(), end(), dest);

        return span<T>(dest, len);
    }